

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::vSolveRight4update2
          (CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *eps,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec,int *idx,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs,int *ridx,int rn,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *vec2,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                eps2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *rhs2,int *ridx2,int rn2,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *forest,int *forestNum,int *forestIdx)

{
  cpp_dec_float<200U,_int,_void> *pcVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps2_00;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps_00;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  bool bVar3;
  bool bVar4;
  type_conflict5 tVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  long lVar9;
  int *piVar10;
  undefined4 *puVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar13;
  uint *puVar14;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  undefined4 *puVar17;
  uint *puVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar19;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar20;
  int iVar21;
  long lVar22;
  byte bVar23;
  undefined1 auStack_698 [12];
  int j_2;
  int *local_688;
  int *local_680;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_678;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_670;
  int *local_668;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_660;
  undefined4 uStack_658;
  int32_t local_654;
  fpclass_type local_650;
  int local_64c;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_648;
  int *local_640;
  int *local_638;
  int j;
  uint uStack_62c;
  int local_5c0;
  bool local_5bc;
  undefined8 local_5b8;
  int j_1;
  int local_540;
  bool local_53c;
  undefined8 local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  uint local_1b0 [28];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  undefined4 local_130 [28];
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  uint local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)eps2.m_backend.data._M_elems._0_8_;
  bVar23 = 0;
  lVar7 = 0x1c;
  puVar14 = (uint *)eps;
  puVar18 = local_b0;
  for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar18 = *puVar14;
    puVar14 = puVar14 + 1;
    puVar18 = puVar18 + 1;
  }
  local_40 = (eps->m_backend).exp;
  local_3c = (eps->m_backend).neg;
  local_38._0_4_ = (eps->m_backend).fpclass;
  local_38._4_4_ = (eps->m_backend).prec_elem;
  puVar11 = (undefined4 *)eps2.m_backend.data._M_elems._0_8_;
  puVar17 = local_130;
  for (; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar17 = *puVar11;
    puVar11 = puVar11 + 1;
    puVar17 = puVar17 + 1;
  }
  local_c0 = *(undefined4 *)(eps2.m_backend.data._M_elems._0_8_ + 0x70);
  local_bc = *(undefined1 *)(eps2.m_backend.data._M_elems._0_8_ + 0x74);
  local_b8 = *(undefined8 *)(eps2.m_backend.data._M_elems._0_8_ + 0x78);
  eps2_00.m_backend.data._M_elems[2] = 0x1c;
  eps2_00.m_backend.data._M_elems[3] = 0;
  eps2_00.m_backend.data._M_elems._0_8_ = local_130;
  eps2_00.m_backend.data._M_elems._16_12_ = auStack_698;
  eps2_00.m_backend.data._M_elems[7] = j_2;
  eps2_00.m_backend.data._M_elems._32_8_ = local_688;
  eps2_00.m_backend.data._M_elems._40_8_ = ridx;
  eps2_00.m_backend.data._M_elems._48_8_ = local_678;
  eps2_00.m_backend.data._M_elems._56_8_ = eps;
  eps2_00.m_backend.data._M_elems._64_8_ = idx;
  eps2_00.m_backend.data._M_elems._72_8_ = rhs;
  eps2_00.m_backend.data._M_elems[0x14] = uStack_658;
  eps2_00.m_backend.data._M_elems[0x15] = local_654;
  eps2_00.m_backend.data._M_elems[0x16] = local_650;
  eps2_00.m_backend.data._M_elems[0x17] = local_64c;
  eps2_00.m_backend.data._M_elems._96_8_ = local_648;
  eps2_00.m_backend.data._M_elems._104_8_ = local_640;
  eps2_00.m_backend._112_8_ = local_638;
  eps2_00.m_backend.fpclass = j;
  eps2_00.m_backend.prec_elem = uStack_62c;
  local_680 = ridx;
  local_670 = eps;
  local_668 = idx;
  local_660 = rhs;
  vSolveLright2(this,rhs,ridx,&rn,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)local_b0,
                (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._8_8_,(int *)eps2.m_backend.data._M_elems._16_8_,
                (int *)(eps2.m_backend.data._M_elems + 6),eps2_00);
  piVar10 = local_680;
  local_678 = vec;
  local_648 = this;
  if (eps2.m_backend.data._M_elems._32_8_ == 0) {
    local_688 = (this->row).perm;
    j_1 = 0;
    for (lVar7 = 0; iVar21 = j_1, lVar7 < rn; lVar7 = lVar7 + 1) {
      iVar21 = piVar10[lVar7];
      pcVar1 = &local_660[iVar21].m_backend;
      iVar2 = local_660[iVar21].m_backend.exp;
      bVar4 = local_660[iVar21].m_backend.neg;
      lVar6 = 0x1c;
      pcVar12 = pcVar1;
      pnVar16 = &local_430;
      for (lVar9 = lVar6; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_430.m_backend.fpclass = local_660[iVar21].m_backend.fpclass;
      local_430.m_backend.prec_elem = local_660[iVar21].m_backend.prec_elem;
      pnVar16 = local_670;
      pnVar20 = &local_4b0;
      local_430.m_backend.exp = iVar2;
      local_430.m_backend.neg = bVar4;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_4b0.m_backend.exp = (local_670->m_backend).exp;
      local_4b0.m_backend.neg = (local_670->m_backend).neg;
      local_4b0.m_backend.fpclass = (local_670->m_backend).fpclass;
      local_4b0.m_backend.prec_elem = (local_670->m_backend).prec_elem;
      bVar4 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_430,&local_4b0);
      if (bVar4) {
        enQueueMax(piVar10,&j_1,local_688[iVar21]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
      }
    }
  }
  else {
    local_640 = (int *)eps2.m_backend.data._M_elems._48_8_;
    local_638 = (this->row).perm;
    j = 0;
    lVar7 = 0x1c;
    piVar8 = (int *)0x0;
    while ((long)piVar8 < (long)rn) {
      iVar21 = piVar10[(long)piVar8];
      lVar9 = (long)iVar21;
      lVar22 = lVar9 * 0x80;
      pcVar1 = &local_660[lVar9].m_backend;
      pcVar12 = pcVar1;
      puVar14 = (uint *)&j_1;
      for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar14 = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
        puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
      }
      local_64c = local_660[lVar9].m_backend.exp;
      bVar4 = local_660[lVar9].m_backend.neg;
      local_650 = local_660[lVar9].m_backend.fpclass;
      local_654 = local_660[lVar9].m_backend.prec_elem;
      pcVar12 = pcVar1;
      pnVar13 = &local_530;
      for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar13->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      pnVar13 = local_670;
      pnVar16 = &local_3b0;
      for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pnVar13->m_backend).data._M_elems[0];
        pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar13 + ((ulong)bVar23 * -2 + 1) * 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = (local_670->m_backend).exp;
      local_3b0.m_backend.neg = (local_670->m_backend).neg;
      local_3b0.m_backend.fpclass = (local_670->m_backend).fpclass;
      local_3b0.m_backend.prec_elem = (local_670->m_backend).prec_elem;
      local_688 = piVar8;
      local_530.m_backend.exp = local_64c;
      local_530.m_backend.neg = bVar4;
      local_530.m_backend.fpclass = local_650;
      local_530.m_backend.prec_elem = local_654;
      bVar3 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_530,&local_3b0);
      piVar10 = local_680;
      if (bVar3) {
        *local_640 = iVar21;
        local_640 = local_640 + 1;
        enQueueMax(local_680,&j,local_638[lVar9]);
        puVar14 = (uint *)&j_1;
        puVar18 = (uint *)(eps2.m_backend.data._M_elems._32_8_ + lVar22);
        for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar18 = *puVar14;
          puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
          puVar18 = puVar18 + (ulong)bVar23 * -2 + 1;
        }
        *(int *)(eps2.m_backend.data._M_elems._32_8_ + 0x70 + lVar22) = local_64c;
        *(bool *)(eps2.m_backend.data._M_elems._32_8_ + 0x74 + lVar22) = bVar4;
        *(fpclass_type *)(eps2.m_backend.data._M_elems._32_8_ + 0x78 + lVar22) = local_650;
        *(int32_t *)(eps2.m_backend.data._M_elems._32_8_ + 0x7c + lVar22) = local_654;
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
        piVar10 = local_680;
      }
      pnVar13 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)eps2.m_backend.data._M_elems._0_8_;
      piVar8 = (int *)((long)local_688 + 1);
    }
    *(int *)eps2.m_backend.data._M_elems._40_8_ = j;
    iVar21 = j;
  }
  piVar10 = (int *)eps2.m_backend.data._M_elems._16_8_;
  rn = iVar21;
  if ((double)(int)eps2.m_backend.data._M_elems[6] <= (double)local_648->thedim * 0.2) {
    local_688 = (local_648->row).perm;
    j_2 = 0;
    for (lVar7 = 0; lVar7 < (int)eps2.m_backend.data._M_elems[6]; lVar7 = lVar7 + 1) {
      iVar21 = piVar10[lVar7];
      lVar22 = (long)iVar21 * 0x80;
      pcVar1 = (cpp_dec_float<200U,_int,_void> *)(eps2.m_backend.data._M_elems._8_8_ + lVar22);
      lVar6 = 0x1c;
      pcVar12 = pcVar1;
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&j_1;
      for (lVar9 = lVar6; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar23 * -8 + 4);
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_540 = *(int *)(eps2.m_backend.data._M_elems._8_8_ + 0x70 + lVar22);
      local_53c = *(bool *)(eps2.m_backend.data._M_elems._8_8_ + 0x74 + lVar22);
      local_538 = *(undefined8 *)(eps2.m_backend.data._M_elems._8_8_ + 0x78 + lVar22);
      pnVar16 = pnVar13;
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&j;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pnVar20->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
        pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar20 + ((ulong)bVar23 * -2 + 1) * 4);
      }
      local_5c0 = (pnVar13->m_backend).exp;
      local_5bc = (pnVar13->m_backend).neg;
      local_5b8._0_4_ = (pnVar13->m_backend).fpclass;
      local_5b8._4_4_ = (pnVar13->m_backend).prec_elem;
      if ((fpclass_type)local_5b8 != cpp_dec_float_finite || j != 0) {
        local_5bc = (bool)(local_5bc ^ 1);
      }
      tVar5 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&j_1,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&j);
      if ((tVar5) ||
         (tVar5 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&j_1,pnVar13), tVar5)) {
        piVar10 = (int *)eps2.m_backend.data._M_elems._16_8_;
        enQueueMax((int *)eps2.m_backend.data._M_elems._16_8_,&j_2,local_688[iVar21]);
      }
      else {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=(pcVar1,0);
        piVar10 = (int *)eps2.m_backend.data._M_elems._16_8_;
      }
    }
    eps2.m_backend.data._M_elems[6] = j_2;
  }
  else {
    *(int *)eps2.m_backend.data._M_elems._16_8_ = local_648->thedim + -1;
  }
  this_00 = local_648;
  piVar8 = local_668;
  pnVar20 = local_670;
  pnVar16 = local_678;
  pnVar15 = local_670;
  puVar14 = local_1b0;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    *puVar14 = (pnVar15->m_backend).data._M_elems[0];
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    puVar14 = puVar14 + (ulong)bVar23 * -2 + 1;
  }
  local_140 = (local_670->m_backend).exp;
  local_13c = (local_670->m_backend).neg;
  local_138._0_4_ = (local_670->m_backend).fpclass;
  local_138._4_4_ = (local_670->m_backend).prec_elem;
  eps_00.m_backend.data._M_elems[2] = 0x1c;
  eps_00.m_backend.data._M_elems[3] = 0;
  eps_00.m_backend.data._M_elems._0_8_ = local_1b0;
  eps_00.m_backend.data._M_elems._16_12_ = auStack_698;
  eps_00.m_backend.data._M_elems[7] = j_2;
  eps_00.m_backend.data._M_elems._32_8_ = local_688;
  eps_00.m_backend.data._M_elems._40_8_ = local_680;
  eps_00.m_backend.data._M_elems._48_8_ = local_678;
  eps_00.m_backend.data._M_elems._56_8_ = local_670;
  eps_00.m_backend.data._M_elems._64_8_ = local_668;
  eps_00.m_backend.data._M_elems._72_8_ = local_660;
  eps_00.m_backend.data._M_elems[0x14] = uStack_658;
  eps_00.m_backend.data._M_elems[0x15] = local_654;
  eps_00.m_backend.data._M_elems[0x16] = local_650;
  eps_00.m_backend.data._M_elems[0x17] = local_64c;
  eps_00.m_backend.data._M_elems._96_8_ = local_648;
  eps_00.m_backend.data._M_elems._104_8_ = local_640;
  eps_00.m_backend._112_8_ = local_638;
  eps_00.m_backend.fpclass = j;
  eps_00.m_backend.prec_elem = uStack_62c;
  rn = vSolveUright(local_648,local_678,local_668,local_660,local_680,rn,eps_00);
  pnVar15 = pnVar13;
  pnVar19 = &local_230;
  for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
    (pnVar19->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
    pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
    pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
  }
  local_230.m_backend.exp = (pnVar13->m_backend).exp;
  local_230.m_backend.neg = (pnVar13->m_backend).neg;
  local_230.m_backend.fpclass = (pnVar13->m_backend).fpclass;
  local_230.m_backend.prec_elem = (pnVar13->m_backend).prec_elem;
  vSolveUrightNoNZ(this_00,vec2,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)eps2.m_backend.data._M_elems._8_8_,piVar10,eps2.m_backend.data._M_elems[6],
                   &local_230);
  if ((this_00->l).updateType == 0) {
    lVar7 = 0x1c;
    pnVar15 = pnVar20;
    pnVar19 = &local_2b0;
    for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar19->m_backend).data._M_elems[0] = (pnVar15->m_backend).data._M_elems[0];
      pnVar15 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar15 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar19 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar19 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_2b0.m_backend.exp = (pnVar20->m_backend).exp;
    local_2b0.m_backend.neg = (pnVar20->m_backend).neg;
    local_2b0.m_backend.fpclass = (pnVar20->m_backend).fpclass;
    local_2b0.m_backend.prec_elem = (pnVar20->m_backend).prec_elem;
    rn = vSolveUpdateRight(this_00,pnVar16,piVar8,rn,&local_2b0);
    pnVar16 = pnVar13;
    pnVar20 = &local_330;
    for (; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pnVar20->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar23 * -2 + 1) * 4);
      pnVar20 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar20 + ((ulong)bVar23 * -2 + 1) * 4);
    }
    local_330.m_backend.exp = (pnVar13->m_backend).exp;
    local_330.m_backend.neg = (pnVar13->m_backend).neg;
    local_330.m_backend.fpclass = (pnVar13->m_backend).fpclass;
    local_330.m_backend.prec_elem = (pnVar13->m_backend).prec_elem;
    vSolveUpdateRightNoNZ(this_00,vec2,&local_330);
  }
  return rn;
}

Assistant:

int CLUFactor<R>::vSolveRight4update2(R eps,
                                      R* vec, int* idx,                  /* result1 */
                                      R* rhs, int* ridx, int rn,         /* rhs1    */
                                      R* vec2, R eps2,              /* result2 */
                                      R* rhs2, int* ridx2, int rn2,      /* rhs2    */
                                      R* forest, int* forestNum, int* forestIdx)
{
   vSolveLright2(rhs, ridx, rn, eps, rhs2, ridx2, rn2, eps2);
   assert(rn >= 0 && rn <= thedim);
   assert(rn2 >= 0 && rn2 <= thedim);

   /*  turn index list into a heap
    */

   if(forest)
   {
      R x;
      int i, j, k;
      int* rperm;
      int* it = forestIdx;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
         {
            enQueueMax(ridx, &j, rperm[*it++ = k]);
            forest[k] = x;
         }
         else
            rhs[k] = 0;
      }

      *forestNum = rn = j;
   }
   else
   {
      R x;
      int i, j, k;
      int* rperm;

      rperm = row.perm;

      for(i = j = 0; i < rn; ++i)
      {
         k = ridx[i];
         assert(k >= 0 && k < thedim);
         x = rhs[k];

         if(isNotZero(x, eps))
            enQueueMax(ridx, &j, rperm[k]);
         else
            rhs[k] = 0;
      }

      rn = j;
   }

   if(rn2 > thedim * verySparseFactor4right)
   {
      ridx2[0] = thedim - 1;
      /* ridx2[1] = thedim - 2; */
   }
   else
   {
      R x;
      /*      R  maxabs; */
      int i, j, k;
      int* rperm;

      /*      maxabs = 1;    */
      rperm = row.perm;

      for(i = j = 0; i < rn2; ++i)
      {
         k = ridx2[i];
         assert(k >= 0 && k < thedim);
         x = rhs2[k];

         if(x < -eps2)
         {
            /*              maxabs = (maxabs < -x) ? -x : maxabs;  */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else if(x > eps2)
         {
            /*              maxabs = (maxabs < x) ? x : maxabs;    */
            enQueueMax(ridx2, &j, rperm[k]);
         }
         else
            rhs2[k] = 0;
      }

      rn2 = j;

      /*      eps2 = maxabs * eps2;  */
   }

   rn = vSolveUright(vec, idx, rhs, ridx, rn, eps);

   vSolveUrightNoNZ(vec2, rhs2, ridx2, rn2, eps2);

   /*
    *  rn = vSolveUright2(vec, idx, rhs, ridx, rn, eps, vec2, rhs2, ridx2, rn2, eps2);
    */

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = vSolveUpdateRight(vec, idx, rn, eps);
      vSolveUpdateRightNoNZ(vec2, eps2);
   }

   return rn;
}